

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_stat(char *_fname,PHYSFS_Stat *stat)

{
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var1;
  void *pvVar2;
  undefined1 *ptr;
  size_t fname_00;
  PHYSFS_Stat *pPVar3;
  int iVar4;
  PHYSFS_ErrorCode PVar5;
  size_t sVar6;
  DirHandle *pDVar7;
  char *pcVar8;
  undefined1 *puVar9;
  undefined1 auStack_68 [7];
  byte local_61;
  undefined1 *local_60;
  char *local_58;
  char *arcfname;
  DirHandle *pDStack_48;
  int exists;
  DirHandle *i;
  size_t len;
  char *fname;
  char *allocated_fname;
  PHYSFS_Stat *pPStack_20;
  int retval;
  PHYSFS_Stat *stat_local;
  char *_fname_local;
  
  puVar9 = auStack_68;
  allocated_fname._4_4_ = 0;
  pPStack_20 = stat;
  stat_local = (PHYSFS_Stat *)_fname;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fname_local._4_4_ = 0;
  }
  else if (stat == (PHYSFS_Stat *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fname_local._4_4_ = 0;
  }
  else {
    stat->filesize = -1;
    stat->modtime = -1;
    stat->createtime = -1;
    stat->accesstime = -1;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;
    __PHYSFS_platformGrabMutex(stateLock);
    sVar6 = strlen((char *)stat_local);
    pDVar7 = (DirHandle *)(sVar6 + longest_root + 1);
    if (pDVar7 < (DirHandle *)0x100) {
      puVar9 = auStack_68 + -(sVar6 + longest_root + 0x18 & 0xfffffffffffffff0);
      local_60 = puVar9;
    }
    else {
      local_60 = (undefined1 *)0x0;
    }
    ptr = local_60;
    i = pDVar7;
    *(undefined8 *)(puVar9 + -8) = 0x10ab5a;
    fname = (char *)__PHYSFS_initSmallAlloc(ptr,(size_t)pDVar7);
    pPVar3 = stat_local;
    if (fname == (char *)0x0) {
      *(undefined8 *)(puVar9 + -8) = 0x10ab6f;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      *(undefined8 *)(puVar9 + -8) = 0x10ab7b;
      __PHYSFS_platformReleaseMutex(stateLock);
      _fname_local._4_4_ = 0;
    }
    else {
      pcVar8 = fname + longest_root;
      len = (size_t)pcVar8;
      *(undefined8 *)(puVar9 + -8) = 0x10aba5;
      iVar4 = sanitizePlatformIndependentPath((char *)pPVar3,pcVar8);
      if (iVar4 != 0) {
        if (*(char *)len == '\0') {
          pPStack_20->filetype = PHYSFS_FILETYPE_DIRECTORY;
          pPStack_20->readonly = (uint)((writeDir != (DirHandle *)0x0 ^ 0xffU) & 1);
          allocated_fname._4_4_ = 1;
        }
        else {
          arcfname._4_4_ = 0;
          pDStack_48 = searchPath;
          while( true ) {
            fname_00 = len;
            pDVar7 = pDStack_48;
            local_61 = 0;
            if (pDStack_48 != (DirHandle *)0x0) {
              local_61 = arcfname._4_4_ != 0 ^ 0xff;
            }
            if ((local_61 & 1) == 0) break;
            local_58 = (char *)len;
            *(undefined8 *)(puVar9 + -8) = 0x10ac35;
            arcfname._4_4_ = partOfMountPoint(pDVar7,(char *)fname_00);
            pDVar7 = pDStack_48;
            if (arcfname._4_4_ == 0) {
              *(undefined8 *)(puVar9 + -8) = 0x10ac6c;
              iVar4 = verifyPath(pDVar7,&local_58,0);
              pPVar3 = pPStack_20;
              pcVar8 = local_58;
              if (iVar4 != 0) {
                p_Var1 = pDStack_48->funcs->stat;
                pvVar2 = pDStack_48->opaque;
                *(undefined8 *)(puVar9 + -8) = 0x10ac8e;
                allocated_fname._4_4_ = (*p_Var1)(pvVar2,pcVar8,pPVar3);
                if (allocated_fname._4_4_ == 0) {
                  *(undefined8 *)(puVar9 + -8) = 0x10ac9c;
                  PVar5 = currentErrorCode();
                  if (PVar5 == PHYSFS_ERR_NOT_FOUND) goto LAB_0010acac;
                }
                arcfname._4_4_ = 1;
              }
            }
            else {
              pPStack_20->filetype = PHYSFS_FILETYPE_DIRECTORY;
              pPStack_20->readonly = 1;
              allocated_fname._4_4_ = 1;
            }
LAB_0010acac:
            pDStack_48 = pDStack_48->next;
          }
        }
      }
      *(undefined8 *)(puVar9 + -8) = 0x10accf;
      __PHYSFS_platformReleaseMutex(stateLock);
      pcVar8 = fname;
      *(undefined8 *)(puVar9 + -8) = 0x10acd8;
      __PHYSFS_smallFree(pcVar8);
      _fname_local._4_4_ = allocated_fname._4_4_;
    }
  }
  return _fname_local._4_4_;
}

Assistant:

int PHYSFS_stat(const char *_fname, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *allocated_fname;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!stat, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    /* set some sane defaults... */
    stat->filesize = -1;
    stat->modtime = -1;
    stat->createtime = -1;
    stat->accesstime = -1;
    stat->filetype = PHYSFS_FILETYPE_OTHER;
    stat->readonly = 1;

    __PHYSFS_platformGrabMutex(stateLock);
    len = strlen(_fname) + longest_root + 1;
    allocated_fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);
    fname = allocated_fname + longest_root;

    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        if (*fname == '\0')
        {
            stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
            stat->readonly = !writeDir; /* Writeable if we have a writeDir */
            retval = 1;
        } /* if */
        else
        {
            DirHandle *i;
            int exists = 0;
            for (i = searchPath; ((i != NULL) && (!exists)); i = i->next)
            {
                char *arcfname = fname;
                exists = partOfMountPoint(i, arcfname);
                if (exists)
                {
                    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
                    stat->readonly = 1;
                    retval = 1;
                } /* if */
                else if (verifyPath(i, &arcfname, 0))
                {
                    retval = i->funcs->stat(i->opaque, arcfname, stat);
                    if ((retval) || (currentErrorCode() != PHYSFS_ERR_NOT_FOUND))
                        exists = 1;
                } /* else if */
            } /* for */
        } /* else */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);

    return retval;
}